

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

bool bssl::ssl_encrypt_ticket(SSL_HANDSHAKE *hs,CBB *out,SSL_SESSION *session)

{
  SSL *pSVar1;
  SSL_TICKET_AEAD_METHOD *pSVar2;
  _Head_base<0UL,_ssl_ctx_st_*,_false> ctx;
  UniquePtr<bssl::TicketKey> UVar3;
  _Head_base<0UL,_unsigned_char_*,_false> in;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *data;
  size_t len_00;
  EVP_CIPHER *cipher;
  EVP_MD *md;
  long lVar8;
  bool bVar9;
  int len;
  uint8_t *ptr_1;
  UniquePtr<uint8_t> free_session_buf;
  uint8_t iv [16];
  size_t session_len;
  uint8_t *session_buf;
  uint8_t key_name [16];
  ScopedHMAC_CTX hctx;
  uint8_t *ptr;
  uint local_184;
  uchar *local_180;
  CRYPTO_MUTEX *local_178;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_170;
  uint8_t local_168 [16];
  ulong local_158;
  _Head_base<0UL,_unsigned_char_*,_false> local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  HMAC_CTX local_130;
  EVP_CIPHER_CTX local_c8;
  
  local_150._M_head_impl = (uchar *)0x0;
  iVar5 = SSL_SESSION_to_bytes_for_ticket(session,&local_150._M_head_impl,&local_158);
  in._M_head_impl = local_150._M_head_impl;
  if (iVar5 == 0) {
    return false;
  }
  local_170._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)local_150._M_head_impl;
  pSVar1 = hs->ssl;
  pSVar2 = ((pSVar1->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_aead_method;
  if (pSVar2 != (SSL_TICKET_AEAD_METHOD *)0x0) {
    uVar7 = (*pSVar2->max_overhead)(pSVar1);
    if (CARRY8(uVar7,local_158)) {
      bVar9 = false;
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x194);
    }
    else {
      iVar5 = CBB_reserve(out,(uint8_t **)&local_c8,uVar7 + local_158);
      if (iVar5 == 0) {
        bVar9 = false;
      }
      else {
        iVar5 = (*pSVar2->seal)(pSVar1,(uint8_t *)local_c8.cipher,(size_t *)&local_130,
                                uVar7 + local_158,in._M_head_impl,local_158);
        if (iVar5 == 0) {
          bVar9 = false;
          ERR_put_error(0x10,0,0x114,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                        ,0x19f);
        }
        else {
          iVar5 = CBB_did_write(out,(size_t)local_130.md);
          bVar9 = iVar5 != 0;
        }
      }
    }
    goto LAB_0015e958;
  }
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_c8);
  HMAC_CTX_init((HMAC_CTX *)&local_130);
  bVar9 = true;
  if (local_158 < 0xff80) {
    ctx._M_head_impl =
         (hs->ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
         .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    if ((ctx._M_head_impl)->ticket_key_cb ==
        (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)0x0) {
      bVar4 = ssl_ctx_rotate_ticket_encryption_key(ctx._M_head_impl);
      bVar9 = false;
      if (bVar4) {
        local_178 = &(ctx._M_head_impl)->lock;
        CRYPTO_MUTEX_lock_read(local_178);
        iVar5 = RAND_bytes(local_168,0x10);
        if (iVar5 != 0) {
          cipher = EVP_aes_128_cbc();
          iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_c8,cipher,(ENGINE *)0x0,
                                     (uchar *)((long)((ctx._M_head_impl)->ticket_key_current)._M_t +
                                              0x20),local_168);
          if (iVar5 != 0) {
            UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl =
                 ((ctx._M_head_impl)->ticket_key_current)._M_t;
            md = EVP_sha256();
            iVar5 = HMAC_Init_ex((HMAC_CTX *)&local_130,
                                 (void *)((long)UVar3._M_t.
                                                super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_bssl::TicketKey_*,_false>.
                                                _M_head_impl + 0x10),0x10,md,(ENGINE *)0x0);
            if (iVar5 != 0) {
              UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl =
                   ((ctx._M_head_impl)->ticket_key_current)._M_t;
              local_148 = *(undefined8 *)
                           UVar3._M_t.
                           super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl;
              uStack_140 = *(undefined8 *)
                            ((long)UVar3._M_t.
                                   super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl + 8
                            );
              CRYPTO_MUTEX_unlock_read(local_178);
              goto LAB_0015e7fd;
            }
          }
        }
        CRYPTO_MUTEX_unlock_read(local_178);
        bVar9 = false;
      }
    }
    else {
      iVar5 = (*(ctx._M_head_impl)->ticket_key_cb)
                        (hs->ssl,(uint8_t *)&local_148,local_168,&local_c8,&local_130,1);
      if (iVar5 < 0) {
        bVar9 = false;
      }
      else if (iVar5 == 0) {
        bVar9 = true;
      }
      else {
LAB_0015e7fd:
        iVar5 = CBB_add_bytes(out,(uint8_t *)&local_148,0x10);
        bVar4 = false;
        bVar9 = false;
        if (iVar5 != 0) {
          uVar6 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)&local_c8);
          iVar5 = CBB_add_bytes(out,local_168,(ulong)uVar6);
          bVar9 = bVar4;
          if (((iVar5 != 0) && (iVar5 = CBB_reserve(out,&local_180,local_158 + 0x20), iVar5 != 0))
             && (iVar5 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&local_c8,local_180,(int *)&local_184,
                                           in._M_head_impl,(int)local_158), iVar5 != 0)) {
            lVar8 = (long)(int)local_184;
            iVar5 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&local_c8,local_180 + lVar8,
                                        (int *)&local_184);
            if ((iVar5 != 0) && (iVar5 = CBB_did_write(out,(int)local_184 + lVar8), iVar5 != 0)) {
              data = CBB_data(out);
              len_00 = CBB_len(out);
              iVar5 = HMAC_Update((HMAC_CTX *)&local_130,data,len_00);
              bVar9 = false;
              if ((iVar5 != 0) &&
                 ((iVar5 = CBB_reserve(out,&local_180,0x40), iVar5 != 0 &&
                  (iVar5 = HMAC_Final((HMAC_CTX *)&local_130,local_180,&local_184), iVar5 != 0)))) {
                iVar5 = CBB_did_write(out,(ulong)local_184);
                bVar9 = iVar5 != 0;
              }
            }
          }
        }
      }
    }
  }
  HMAC_CTX_cleanup((HMAC_CTX *)&local_130);
  EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_c8);
LAB_0015e958:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_170);
  return bVar9;
}

Assistant:

bool ssl_encrypt_ticket(SSL_HANDSHAKE *hs, CBB *out,
                        const SSL_SESSION *session) {
  // Serialize the SSL_SESSION to be encoded into the ticket.
  uint8_t *session_buf = nullptr;
  size_t session_len;
  if (!SSL_SESSION_to_bytes_for_ticket(session, &session_buf, &session_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_session_buf(session_buf);

  if (hs->ssl->session_ctx->ticket_aead_method) {
    return ssl_encrypt_ticket_with_method(hs, out, session_buf, session_len);
  } else {
    return ssl_encrypt_ticket_with_cipher_ctx(hs, out, session_buf,
                                              session_len);
  }
}